

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeBranded
          (Impl *this,RawSchema *schema,Reader proto,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *clientBrand)

{
  Reader type;
  StringPtr scopeName_00;
  undefined3 uVar1;
  bool bVar2;
  Which WVar3;
  Which WVar4;
  uint uVar5;
  ulong uVar6;
  Scope *pSVar7;
  size_t sVar8;
  Binding *pBVar9;
  unsigned_long *puVar10;
  uint64_t uVar11;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *this_00;
  Scope *pSVar12;
  RawBrandedSchema *pRVar13;
  Reader RVar14;
  ArrayPtr<capnp::_::RawBrandedSchema::Scope> AVar15;
  Iterator IVar16;
  ArrayPtr<capnp::_::RawBrandedSchema::Binding> AVar17;
  Range<unsigned_long> RVar18;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> AVar19;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> bindings;
  Scope *clientScope;
  Scope *__end6;
  Scope *__begin6;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *__range6;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *b;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *_b1485;
  Scope *dstScope_1;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> local_538;
  Scope *local_528;
  Scope *dstScope;
  char *local_508;
  size_t sStack_500;
  Reader local_4f8;
  Binding *local_4c8;
  Binding *dstBinding;
  Reader srcBinding;
  unsigned_long j;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_long> *__range4;
  ArrayPtr<capnp::_::RawBrandedSchema::Binding> dstBindings;
  Array<capnp::_::RawBrandedSchema::Binding> dstBindings_heap;
  Binding dstBindings_stack [16];
  bool dstBindings_isOnStack;
  size_t dstBindings_size;
  Reader srcBindings;
  Reader srcScope;
  undefined1 local_2b0 [8];
  Iterator __end1;
  undefined1 local_290 [8];
  Iterator __begin1;
  Reader *__range1;
  uint dstScopeCount;
  undefined1 auStack_268 [8];
  ArrayPtr<capnp::_::RawBrandedSchema::Scope> dstScopes;
  undefined1 local_250 [8];
  Array<capnp::_::RawBrandedSchema::Scope> dstScopes_heap;
  Scope dstScopes_stack [16];
  bool dstScopes_isOnStack;
  size_t dstScopes_size;
  Reader srcScopes;
  char *local_40;
  size_t local_38;
  StringPtr scopeName;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *clientBrand_local;
  RawSchema *schema_local;
  Impl *this_local;
  
  readMessageUnchecked<capnp::schema::Node>
            ((Reader *)&srcScopes.reader.nestingLimit,schema->encodedNode);
  RVar14 = capnp::schema::Node::Reader::getDisplayName((Reader *)&srcScopes.reader.nestingLimit);
  local_40 = RVar14.super_StringPtr.content.ptr;
  local_38 = RVar14.super_StringPtr.content.size_;
  capnp::schema::Brand::Reader::getScopes((Reader *)&dstScopes_size,&proto);
  uVar5 = List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::size((Reader *)&dstScopes_size)
  ;
  uVar6 = (ulong)uVar5;
  if (uVar6 < 0x11) {
    kj::Array<capnp::_::RawBrandedSchema::Scope>::Array
              ((Array<capnp::_::RawBrandedSchema::Scope> *)local_250,(void *)0x0);
    AVar15 = kj::arrayPtr<capnp::_::RawBrandedSchema::Scope>
                       ((Scope *)&dstScopes_heap.disposer,uVar6);
  }
  else {
    kj::heapArray<capnp::_::RawBrandedSchema::Scope>
              ((Array<capnp::_::RawBrandedSchema::Scope> *)local_250,uVar6);
    AVar15 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_250);
  }
  dstScopes.ptr = (Scope *)AVar15.size_;
  auStack_268 = (undefined1  [8])AVar15.ptr;
  pSVar7 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope>::begin
                     ((ArrayPtr<capnp::_::RawBrandedSchema::Scope> *)auStack_268);
  sVar8 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope>::size
                    ((ArrayPtr<capnp::_::RawBrandedSchema::Scope> *)auStack_268);
  memset(pSVar7,0,sVar8 * 0x18);
  __range1._0_4_ = 0;
  __begin1._8_8_ = &dstScopes_size;
  IVar16 = List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::begin
                     ((Reader *)__begin1._8_8_);
  __end1._8_8_ = IVar16.container;
  __begin1.container._0_4_ = IVar16.index;
  local_290 = (undefined1  [8])__end1._8_8_;
  IVar16 = List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::end((Reader *)__begin1._8_8_);
  local_2b0 = (undefined1  [8])IVar16.container;
  __end1.container._0_4_ = IVar16.index;
  do {
    bVar2 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
            ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                          *)local_290,
                         (IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                          *)local_2b0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      AVar15 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope>::first
                         ((ArrayPtr<capnp::_::RawBrandedSchema::Scope> *)auStack_268,
                          (ulong)(uint)__range1);
      dstScopes.ptr = (Scope *)AVar15.size_;
      auStack_268 = (undefined1  [8])AVar15.ptr;
      pSVar7 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope>::begin
                         ((ArrayPtr<capnp::_::RawBrandedSchema::Scope> *)auStack_268);
      pSVar12 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope>::end
                          ((ArrayPtr<capnp::_::RawBrandedSchema::Scope> *)auStack_268);
      std::
      sort<capnp::_::RawBrandedSchema::Scope*,capnp::SchemaLoader::Impl::makeBranded(capnp::_::RawSchema_const*,capnp::schema::Brand::Reader,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>
                (pSVar7,pSVar12);
      AVar15.size_ = (size_t)dstScopes.ptr;
      AVar15.ptr = (Scope *)auStack_268;
      bindings = copyDeduped<capnp::_::RawBrandedSchema::Scope>(this,AVar15);
      pRVar13 = makeBranded(this,schema,bindings);
      kj::Array<capnp::_::RawBrandedSchema::Scope>::~Array
                ((Array<capnp::_::RawBrandedSchema::Scope> *)local_250);
      return pRVar13;
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
    ::operator*((Reader *)&srcBindings.reader.nestingLimit,
                (IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                 *)local_290);
    WVar3 = capnp::schema::Brand::Scope::Reader::which((Reader *)&srcBindings.reader.nestingLimit);
    if (WVar3 == BIND) {
      capnp::schema::Brand::Scope::Reader::getBind
                ((Reader *)&dstBindings_size,(Reader *)&srcBindings.reader.nestingLimit);
      uVar5 = List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader::size
                        ((Reader *)&dstBindings_size);
      uVar6 = (ulong)uVar5;
      if (uVar6 < 0x11) {
        kj::Array<capnp::_::RawBrandedSchema::Binding>::Array
                  ((Array<capnp::_::RawBrandedSchema::Binding> *)&dstBindings.size_,(void *)0x0);
        AVar17 = kj::arrayPtr<capnp::_::RawBrandedSchema::Binding>
                           ((Binding *)&dstBindings_heap.disposer,uVar6);
      }
      else {
        kj::heapArray<capnp::_::RawBrandedSchema::Binding>
                  ((Array<capnp::_::RawBrandedSchema::Binding> *)&dstBindings.size_,uVar6);
        AVar17 = kj::Array::operator_cast_to_ArrayPtr((Array *)&dstBindings.size_);
      }
      dstBindings.ptr = (Binding *)AVar17.size_;
      __range4 = (Range<unsigned_long> *)AVar17.ptr;
      pBVar9 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Binding>::begin
                         ((ArrayPtr<capnp::_::RawBrandedSchema::Binding> *)&__range4);
      sVar8 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Binding>::size
                        ((ArrayPtr<capnp::_::RawBrandedSchema::Binding> *)&__range4);
      memset(pBVar9,0,sVar8 << 4);
      RVar18 = kj::indices<capnp::List<capnp::schema::Brand::Binding,(capnp::Kind)3>::Reader&>
                         ((Reader *)&dstBindings_size);
      __begin4.value = RVar18.begin_;
      __end4 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin4);
      j = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin4);
      while( true ) {
        bVar2 = kj::Range<unsigned_long>::Iterator::operator==(&__end4,(Iterator *)&j);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        puVar10 = kj::Range<unsigned_long>::Iterator::operator*(&__end4);
        srcBinding._reader._40_8_ = *puVar10;
        List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)&dstBinding,(Reader *)&dstBindings_size,srcBinding._reader.nestingLimit
                  );
        local_4c8 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Binding>::operator[]
                              ((ArrayPtr<capnp::_::RawBrandedSchema::Binding> *)&__range4,
                               srcBinding._reader._40_8_);
        local_4c8->which = '\0';
        local_4c8->isImplicitParameter = false;
        local_4c8->listDepth = 0;
        local_4c8->paramIndex = 0;
        *(undefined2 *)&local_4c8->field_0x6 = 0;
        (local_4c8->field_4).schema = (RawBrandedSchema *)0x0;
        local_4c8->which = '\x12';
        WVar4 = capnp::schema::Brand::Binding::Reader::which((Reader *)&dstBinding);
        pBVar9 = local_4c8;
        if ((WVar4 != UNBOUND) && (WVar4 == TYPE)) {
          capnp::schema::Brand::Binding::Reader::getType(&local_4f8,(Reader *)&dstBinding);
          local_508 = local_40;
          sStack_500 = local_38;
          kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
                    ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&dstScope,
                     clientBrand);
          scopeName_00.content.size_ = sStack_500;
          scopeName_00.content.ptr = local_508;
          type._reader.capTable = local_4f8._reader.capTable;
          type._reader.segment = local_4f8._reader.segment;
          type._reader.data = local_4f8._reader.data;
          type._reader.pointers = local_4f8._reader.pointers;
          type._reader.dataSize = local_4f8._reader.dataSize;
          type._reader.pointerCount = local_4f8._reader.pointerCount;
          type._reader._38_2_ = local_4f8._reader._38_2_;
          type._reader.nestingLimit = local_4f8._reader.nestingLimit;
          type._reader._44_4_ = local_4f8._reader._44_4_;
          makeDep(this,pBVar9,type,scopeName_00,
                  (Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&dstScope);
          kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe
                    ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&dstScope);
        }
        kj::Range<unsigned_long>::Iterator::operator++(&__end4);
      }
      uVar6 = (ulong)(uint)__range1;
      __range1._0_4_ = (uint)__range1 + 1;
      local_528 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope>::operator[]
                            ((ArrayPtr<capnp::_::RawBrandedSchema::Scope> *)auStack_268,uVar6);
      uVar11 = capnp::schema::Brand::Scope::Reader::getScopeId
                         ((Reader *)&srcBindings.reader.nestingLimit);
      local_528->typeId = uVar11;
      sVar8 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Binding>::size
                        ((ArrayPtr<capnp::_::RawBrandedSchema::Binding> *)&__range4);
      local_528->bindingCount = (uint)sVar8;
      AVar17.size_ = (size_t)dstBindings.ptr;
      AVar17.ptr = (Binding *)__range4;
      AVar19 = copyDeduped<capnp::_::RawBrandedSchema::Binding>(this,AVar17);
      local_538 = AVar19;
      pBVar9 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Binding>::begin(&local_538);
      local_528->bindings = pBVar9;
      kj::Array<capnp::_::RawBrandedSchema::Binding>::~Array
                ((Array<capnp::_::RawBrandedSchema::Binding> *)&dstBindings.size_);
    }
    else if (WVar3 == INHERIT) {
      uVar6 = (ulong)(uint)__range1;
      __range1._0_4_ = (uint)__range1 + 1;
      pSVar7 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope>::operator[]
                         ((ArrayPtr<capnp::_::RawBrandedSchema::Scope> *)auStack_268,uVar6);
      uVar11 = capnp::schema::Brand::Scope::Reader::getScopeId
                         ((Reader *)&srcBindings.reader.nestingLimit);
      pSVar7->typeId = uVar11;
      this_00 = kj::_::readMaybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>(clientBrand)
      ;
      if (this_00 == (ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)0x0) {
        pSVar7->isUnbound = true;
      }
      else {
        __end6 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::begin(this_00);
        pSVar12 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::end(this_00);
        for (; __end6 != pSVar12; __end6 = __end6 + 1) {
          if (__end6->typeId == pSVar7->typeId) {
            pSVar7->typeId = __end6->typeId;
            pSVar7->bindings = __end6->bindings;
            bVar2 = __end6->isUnbound;
            uVar1 = *(undefined3 *)&__end6->field_0x15;
            pSVar7->bindingCount = __end6->bindingCount;
            pSVar7->isUnbound = bVar2;
            *(undefined3 *)&pSVar7->field_0x15 = uVar1;
            break;
          }
        }
      }
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                  *)local_290);
  } while( true );
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeBranded(
    const _::RawSchema* schema, schema::Brand::Reader proto,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> clientBrand) {
  kj::StringPtr scopeName =
      readMessageUnchecked<schema::Node>(schema->encodedNode).getDisplayName();

  auto srcScopes = proto.getScopes();

  KJ_STACK_ARRAY(_::RawBrandedSchema::Scope, dstScopes, srcScopes.size(), 16, 32);
  memset(dstScopes.begin(), 0, dstScopes.size() * sizeof(dstScopes[0]));

  uint dstScopeCount = 0;
  for (auto srcScope: srcScopes) {
    switch (srcScope.which()) {
      case schema::Brand::Scope::BIND: {
        auto srcBindings = srcScope.getBind();
        KJ_STACK_ARRAY(_::RawBrandedSchema::Binding, dstBindings, srcBindings.size(), 16, 32);
        memset(dstBindings.begin(), 0, dstBindings.size() * sizeof(dstBindings[0]));

        for (auto j: kj::indices(srcBindings)) {
          auto srcBinding = srcBindings[j];
          auto& dstBinding = dstBindings[j];

          memset(&dstBinding, 0, sizeof(dstBinding));
          dstBinding.which = schema::Type::ANY_POINTER;

          switch (srcBinding.which()) {
            case schema::Brand::Binding::UNBOUND:
              break;
            case schema::Brand::Binding::TYPE: {
              makeDep(dstBinding, srcBinding.getType(), scopeName, clientBrand);
              break;
            }
          }
        }

        auto& dstScope = dstScopes[dstScopeCount++];
        dstScope.typeId = srcScope.getScopeId();
        dstScope.bindingCount = dstBindings.size();
        dstScope.bindings = copyDeduped(dstBindings).begin();
        break;
      }
      case schema::Brand::Scope::INHERIT: {
        // Inherit the whole scope from the client -- or if the client doesn't have it, at least
        // include an empty dstScope in the list just to show that this scope was specified as
        // inherited, as opposed to being unspecified (which would be treated as all AnyPointer).
        auto& dstScope = dstScopes[dstScopeCount++];
        dstScope.typeId = srcScope.getScopeId();

        KJ_IF_SOME(b, clientBrand) {
          for (auto& clientScope: b) {
            if (clientScope.typeId == dstScope.typeId) {
              // Overwrite the whole thing.
              dstScope = clientScope;
              break;
            }
          }
        } else {
          dstScope.isUnbound = true;
        }
        break;
      }
    }
  }